

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_bfins_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  long lVar1;
  uint16_t uVar2;
  uintptr_t o_1;
  TCGv_i32 pTVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_3;
  TCGTemp *local_58;
  TCGv_i32 local_50;
  long local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar2 = read_im16(env,s);
  lVar1 = *(long *)((long)tcg_ctx->cpu_dregs + (ulong)(uVar2 >> 9 & 0x38));
  pTVar3 = gen_lea(env,s,insn,7);
  if (pTVar3 != tcg_ctx->NULL_QREG) {
    if ((uVar2 & 0x20) == 0) {
      pTVar4 = tcg_const_i32_m68k(tcg_ctx,uVar2 & 0x1f);
    }
    else {
      pTVar4 = tcg_ctx->cpu_dregs[uVar2 & 7];
    }
    if ((uVar2 >> 0xb & 1) == 0) {
      pTVar5 = tcg_const_i32_m68k(tcg_ctx,uVar2 >> 6 & 0x1f);
    }
    else {
      pTVar5 = tcg_ctx->cpu_dregs[uVar2 >> 6 & 7];
    }
    local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_50 = pTVar3 + (long)tcg_ctx;
    local_48 = (long)&tcg_ctx->pool_cur + lVar1;
    local_40 = (TCGTemp *)(pTVar5 + (long)tcg_ctx);
    local_38 = (TCGTemp *)(pTVar4 + (long)tcg_ctx);
    tcg_gen_callN_m68k(tcg_ctx,helper_bfins_mem_m68k,(TCGTemp *)(QREG_CC_N + (long)tcg_ctx),5,
                       &local_58);
    set_cc_op(s,CC_OP_LOGIC);
    if ((uVar2 & 0x20) == 0) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
    }
    if ((uVar2 >> 0xb & 1) == 0) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar5 + (long)tcg_ctx));
    }
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(bfins_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    TCGv src = DREG(ext, 12);
    TCGv addr, len, ofs;

    addr = gen_lea(env, s, insn, OS_UNSIZED);
    if (IS_NULL_QREG(addr)) {
        gen_addr_fault(s);
        return;
    }

    if (ext & 0x20) {
        len = DREG(ext, 0);
    } else {
        len = tcg_const_i32(tcg_ctx, extract32(ext, 0, 5));
    }
    if (ext & 0x800) {
        ofs = DREG(ext, 6);
    } else {
        ofs = tcg_const_i32(tcg_ctx, extract32(ext, 6, 5));
    }

    gen_helper_bfins_mem(tcg_ctx, QREG_CC_N, tcg_ctx->cpu_env, addr, src, ofs, len);
    set_cc_op(s, CC_OP_LOGIC);

    if (!(ext & 0x20)) {
        tcg_temp_free(tcg_ctx, len);
    }
    if (!(ext & 0x800)) {
        tcg_temp_free(tcg_ctx, ofs);
    }
}